

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O3

void __thiscall Memory::~Memory(Memory *this)

{
  pointer pBVar1;
  pointer pcVar2;
  int iVar3;
  int *piVar4;
  char *__s;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string local_40;
  allocator<char> local_19;
  
  iVar3 = munmap(this->start_address,this->size);
  if (iVar3 == -1) {
    paVar5 = &local_40.field_2;
    local_40._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"munmap failed with error:","");
    Logger::log_error(&local_40,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar5) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    piVar4 = __errno_location();
    __s = strerror(*piVar4);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,__s,&local_19);
    Logger::log_data(&local_40,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar5) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  pBVar1 = (this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pBVar1 != (pointer)0x0) {
    operator_delete(pBVar1,(long)(this->flipped_bits).
                                 super__Vector_base<BitFlip,_std::allocator<BitFlip>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage - (long)pBVar1);
  }
  pcVar2 = (this->hugetlbfs_mountpoint)._M_dataplus._M_p;
  paVar5 = &(this->hugetlbfs_mountpoint).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar5) {
    operator_delete(pcVar2,paVar5->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

Memory::~Memory() {
  if (munmap((void *) start_address, size)==-1) {
    Logger::log_error("munmap failed with error:");
    Logger::log_data(std::strerror(errno));
  }
}